

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

void __thiscall
libDAI::MaxPlus::SetAnyTimeResults(MaxPlus *this,bool turn_on,ofstream *results,ofstream *timings)

{
  ofstream *timings_local;
  ofstream *results_local;
  bool turn_on_local;
  MaxPlus *this_local;
  
  this->writeAnyTimeResults = turn_on;
  if (turn_on) {
    this->results_f = results;
    this->timings_f = timings;
  }
  else {
    this->results_f = (ofstream *)0x0;
    this->timings_f = (ofstream *)0x0;
  }
  return;
}

Assistant:

void MaxPlus::SetAnyTimeResults(bool turn_on, 
            ofstream* results, ofstream* timings)
    {
        writeAnyTimeResults = turn_on;
        if(turn_on)
        {
            results_f = results;
            timings_f = timings;         
        }
        else
        {
            results_f = NULL;
            timings_f = NULL;
        }

    }